

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O2

CURLcode cw_out_append(cw_out_ctx *ctx,cw_out_type otype,char *buf,size_t blen)

{
  CURLcode CVar1;
  size_t sVar2;
  cw_out_buf *pcVar3;
  long lVar4;
  cw_out_buf **ppcVar5;
  
  ppcVar5 = &ctx->buf;
  lVar4 = 0;
  pcVar3 = (cw_out_buf *)ppcVar5;
  while (pcVar3 = pcVar3->next, pcVar3 != (cw_out_buf *)0x0) {
    sVar2 = Curl_dyn_len(&pcVar3->b);
    lVar4 = lVar4 + sVar2;
  }
  if (lVar4 + blen < 0x4000001) {
    pcVar3 = *ppcVar5;
    if (((pcVar3 == (cw_out_buf *)0x0) || (otype == CW_OUT_HDS)) || (pcVar3->type != otype)) {
      pcVar3 = (cw_out_buf *)(*Curl_ccalloc)(1,0x30);
      if (pcVar3 == (cw_out_buf *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar3->type = otype;
      Curl_dyn_init(&pcVar3->b,0x4000000);
      pcVar3->next = *ppcVar5;
      *ppcVar5 = pcVar3;
    }
    CVar1 = Curl_dyn_addn(&pcVar3->b,buf,blen);
    return CVar1;
  }
  return CURLE_TOO_LARGE;
}

Assistant:

static CURLcode cw_out_append(struct cw_out_ctx *ctx,
                              cw_out_type otype,
                              const char *buf, size_t blen)
{
  if(cw_out_bufs_len(ctx) + blen > DYN_PAUSE_BUFFER)
    return CURLE_TOO_LARGE;

  /* if we do not have a buffer, or it is of another type, make a new one.
   * And for CW_OUT_HDS always make a new one, so we "replay" headers
   * exactly as they came in */
  if(!ctx->buf || (ctx->buf->type != otype) || (otype == CW_OUT_HDS)) {
    struct cw_out_buf *cwbuf = cw_out_buf_create(otype);
    if(!cwbuf)
      return CURLE_OUT_OF_MEMORY;
    cwbuf->next = ctx->buf;
    ctx->buf = cwbuf;
  }
  DEBUGASSERT(ctx->buf && (ctx->buf->type == otype));
  return Curl_dyn_addn(&ctx->buf->b, buf, blen);
}